

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

bool tinyusdz::is_valid_utf8_identifier(string *str)

{
  bool bVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> codepoints;
  
  to_codepoints(&codepoints,str);
  if (codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0021313b:
    bVar1 = false;
  }
  else {
    if (*codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start != 0x5f) {
      bVar1 = unicode_xid::is_xid_start
                        (*codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if (!bVar1) goto LAB_0021313b;
    }
    for (uVar3 = 1;
        bVar1 = (ulong)((long)codepoints.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)codepoints.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3, !bVar1;
        uVar3 = uVar3 + 1) {
      if (codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] != 0x5f) {
        bVar2 = unicode_xid::is_xid_continue
                          (codepoints.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3]);
        if (!bVar2) break;
      }
    }
  }
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar1;
}

Assistant:

bool is_valid_utf8_identifier(const std::string &str) {
  // First convert to codepoint values.
  std::vector<uint32_t> codepoints = to_codepoints(str);

  if (codepoints.empty()) {
    return false;
  }

  // (XID_Start|_) (XID_Continue|_)+
  
  if ((codepoints[0] != '_') && !unicode_xid::is_xid_start(codepoints[0])) {
    return false;
  }

  for (size_t i = 1; i < codepoints.size(); i++) {
    if ((codepoints[i] != '_') && !unicode_xid::is_xid_continue(codepoints[i])) {
      return false;
    }
  }

  return true; 
}